

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  double **ppdVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  double *pdVar25;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_119;
  ulong local_118;
  ulong local_110;
  double *local_108;
  double *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  int local_d4;
  BeagleCPUImpl<double,_1,_0> *local_d0;
  double *local_c8;
  double *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  double *local_90;
  double *local_88;
  ulong local_80;
  long local_78;
  long local_70;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_b8 = parentBufferIndices;
  local_b0 = childBufferIndices;
  local_a8 = probabilityIndices;
  local_a0 = categoryWeightsIndices;
  local_98 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)this->kPatternCount,&local_119);
  uVar16 = (ulong)(uint)this->kPatternCount;
  if (0 < count) {
    local_80 = (ulong)(count - 1);
    local_118 = (ulong)(uint)count;
    uVar18 = 0;
    local_d0 = this;
    do {
      local_c0 = this->gPartials[local_b8[uVar18]];
      local_108 = this->gTransitionMatrices[local_a8[uVar18]];
      local_c8 = this->gCategoryWeights[local_a0[uVar18]];
      local_100 = this->gStateFrequencies[local_98[uVar18]];
      iVar24 = local_b0[uVar18];
      local_f8 = uVar18;
      memset(this->integrationTmp,0,(long)(int)uVar16 * (long)this->kStateCount * 8);
      uVar11 = local_118;
      if ((iVar24 < this->kTipCount) && (piVar8 = this->gTipStates[iVar24], piVar8 != (int *)0x0)) {
        local_f0 = (long)this->kCategoryCount;
        uVar19 = this->kPatternCount;
        uVar16 = (ulong)uVar19;
        if (0 < local_f0) {
          iVar24 = this->kPartialsPaddedStateCount;
          iVar5 = this->kMatrixSize;
          uVar6 = this->kStateCount;
          lVar23 = 0;
          iVar21 = 0;
          local_110 = CONCAT44(local_110._4_4_,iVar5);
          lVar13 = 0;
          do {
            if (0 < (int)uVar19) {
              local_e8 = CONCAT44(local_e8._4_4_,iVar21);
              iVar7 = this->kTransPaddedStateCount;
              pdVar25 = this->integrationTmp;
              lVar13 = (long)(int)lVar13;
              uVar18 = 0;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = local_c8[lVar23];
              pdVar17 = local_c0 + lVar13;
              iVar20 = 0;
              do {
                if (0 < (int)uVar6) {
                  pdVar14 = local_108 + (long)iVar21 + (long)piVar8[uVar18];
                  uVar15 = 0;
                  do {
                    dVar27 = *pdVar14;
                    pdVar14 = pdVar14 + iVar7;
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar25[(long)iVar20 + uVar15];
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = dVar27 * pdVar17[uVar15];
                    auVar29 = vfmadd213sd_fma(auVar32,auVar28,auVar1);
                    pdVar25[(long)iVar20 + uVar15] = auVar29._0_8_;
                    uVar15 = uVar15 + 1;
                  } while (uVar6 != uVar15);
                  iVar20 = iVar20 + (int)uVar15;
                }
                lVar13 = lVar13 + iVar24;
                uVar18 = uVar18 + 1;
                pdVar17 = pdVar17 + iVar24;
                this = local_d0;
                local_e0 = lVar23;
              } while (uVar18 != uVar16);
            }
            iVar21 = iVar21 + iVar5;
            lVar23 = lVar23 + 1;
          } while (lVar23 != local_f0);
        }
      }
      else {
        local_78 = (long)this->kCategoryCount;
        uVar19 = this->kPatternCount;
        uVar16 = (ulong)uVar19;
        if (0 < local_78) {
          local_d4 = this->kMatrixSize;
          uVar6 = this->kStateCount;
          local_110 = 0;
          local_e8 = (long)this->kPartialsPaddedStateCount;
          local_88 = this->gPartials[iVar24];
          uVar12 = uVar6 + 3;
          if (-1 < (int)uVar6) {
            uVar12 = uVar6;
          }
          lVar23 = 0;
          local_f0 = local_e8 * 8;
          local_90 = local_88 + 2;
          lVar13 = 0;
          do {
            if (0 < (int)uVar19) {
              pdVar14 = this->integrationTmp;
              lVar23 = (long)(int)lVar23;
              uVar22 = 0;
              lVar26 = 0;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = local_c8[lVar13];
              pdVar17 = local_90 + lVar23;
              pdVar25 = local_88 + lVar23;
              do {
                if (0 < (int)uVar6) {
                  lVar26 = (long)(int)lVar26;
                  uVar15 = 0;
                  uVar18 = local_110;
                  do {
                    iVar24 = (int)uVar18;
                    if ((int)uVar6 < 4) {
                      auVar33 = ZEXT816(0);
                      uVar18 = 0;
                    }
                    else {
                      auVar33 = ZEXT816(0);
                      uVar18 = 0;
                      do {
                        auVar33 = vfmadd231pd_fma(auVar33,*(undefined1 (*) [16])
                                                           (local_108 + (long)iVar24 + uVar18),
                                                  *(undefined1 (*) [16])(pdVar17 + (uVar18 - 2)));
                        auVar33 = vfmadd231pd_fma(auVar33,*(undefined1 (*) [16])
                                                           (local_108 + (long)iVar24 + uVar18 + 2),
                                                  *(undefined1 (*) [16])(pdVar17 + uVar18));
                        uVar18 = uVar18 + 4;
                      } while ((long)uVar18 < (long)(int)(uVar12 & 0xfffffffc));
                    }
                    dVar27 = auVar33._0_8_;
                    if ((int)uVar18 < (int)uVar6) {
                      uVar18 = uVar18 & 0xffffffff;
                      auVar28 = auVar33;
                      do {
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = local_108[(long)iVar24 + uVar18];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar25[uVar18];
                        auVar28 = vfmadd231sd_fma(auVar28,auVar36,auVar2);
                        dVar27 = auVar28._0_8_;
                        uVar18 = uVar18 + 1;
                      } while (uVar6 != uVar18);
                    }
                    auVar28 = vshufpd_avx(auVar33,auVar33,1);
                    uVar18 = (ulong)(iVar24 + uVar6 + 1);
                    lVar10 = lVar23 + uVar15;
                    uVar15 = uVar15 + 1;
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = pdVar14[lVar26];
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = (auVar28._0_8_ + dVar27) * local_c0[lVar10];
                    auVar33 = vfmadd213sd_fma(auVar34,auVar29,auVar33);
                    pdVar14[lVar26] = auVar33._0_8_;
                    lVar26 = lVar26 + 1;
                    local_e0 = lVar23;
                  } while (uVar15 != uVar6);
                }
                lVar23 = lVar23 + local_e8;
                uVar22 = uVar22 + 1;
                pdVar17 = pdVar17 + local_e8;
                pdVar25 = pdVar25 + local_e8;
                this = local_d0;
                local_70 = lVar13;
              } while (uVar22 != uVar19);
            }
            lVar13 = lVar13 + 1;
            local_110 = (ulong)(uint)((int)local_110 + local_d4);
            local_68 = uVar16;
          } while (lVar13 != local_78);
        }
      }
      uVar18 = local_f8;
      if (0 < (int)uVar16) {
        lVar13 = 0;
        iVar24 = 0;
        pdVar17 = local_100;
        do {
          iVar5 = this->kStateCount;
          if ((long)iVar5 < 1) {
            pdVar25 = (double *)0x0;
          }
          else {
            auVar29 = ZEXT816(0);
            lVar23 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = pdVar17[lVar23];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = this->integrationTmp[iVar24 + lVar23];
              auVar29 = vfmadd231sd_fma(auVar29,auVar30,auVar3);
              pdVar25 = auVar29._0_8_;
              lVar23 = lVar23 + 1;
            } while (iVar5 != lVar23);
            iVar24 = iVar24 + iVar5;
          }
          if (*scalingFactorsIndices != -1) {
            ppdVar9 = this->gScaleBuffers;
            pdVar14 = ppdVar9[scalingFactorsIndices[uVar18]];
            if (uVar18 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] = 0;
              uVar19 = 0;
              dVar27 = pdVar14[lVar13];
              auVar31 = ZEXT864((ulong)dVar27);
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = dVar27;
              if (count != 1) {
                uVar16 = 1;
                uVar19 = 0;
                do {
                  dVar27 = ppdVar9[scalingFactorsIndices[uVar16]][lVar13];
                  if (auVar31._0_8_ < dVar27) {
                    uVar19 = (uint)uVar16;
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = uVar19;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = dVar27;
                    auVar31 = ZEXT864((ulong)dVar27);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar11 != uVar16);
              }
            }
            else {
              uVar19 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13];
            }
            pdVar17 = local_100;
            if (uVar18 != uVar19) {
              local_108 = pdVar25;
              dVar27 = exp(pdVar14[lVar13] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13]);
              pdVar25 = (double *)((double)local_108 * dVar27);
              pdVar17 = local_100;
              uVar18 = local_f8;
            }
          }
          pdVar14 = this->outLogLikelihoodsTmp;
          if (uVar18 == 0) {
            pdVar14[lVar13] = (double)pdVar25;
          }
          else {
            dVar27 = (double)pdVar25 + pdVar14[lVar13];
            if (uVar18 == local_80) {
              dVar27 = log(dVar27);
              pdVar14 = this->outLogLikelihoodsTmp;
              pdVar17 = local_100;
              uVar18 = local_f8;
            }
            pdVar14[lVar13] = dVar27;
          }
          uVar16 = (ulong)this->kPatternCount;
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)uVar16);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar11);
  }
  if (*scalingFactorsIndices == -1) {
LAB_00127bac:
    *outSumLogLikelihood = 0.0;
    if (0 < (int)uVar16) {
      pdVar17 = this->gPatternWeights;
      pdVar25 = this->outLogLikelihoodsTmp;
      auVar29 = ZEXT816(0) << 0x40;
      uVar18 = 0;
      do {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pdVar25[uVar18];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pdVar17[uVar18];
        auVar29 = vfmadd231sd_fma(auVar29,auVar35,auVar4);
        uVar18 = uVar18 + 1;
        dVar27 = auVar29._0_8_;
        *outSumLogLikelihood = dVar27;
      } while ((uVar16 & 0xffffffff) != uVar18);
      iVar24 = (uint)(!NAN(dVar27) && !NAN(dVar27)) * 8 + -8;
      goto LAB_00127c01;
    }
  }
  else {
    if (0 < (int)uVar16) {
      pdVar17 = this->outLogLikelihoodsTmp;
      uVar18 = 0;
      do {
        pdVar17[uVar18] =
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar18] + pdVar17[uVar18];
        uVar18 = uVar18 + 1;
      } while ((uVar16 & 0xffffffff) != uVar18);
      goto LAB_00127bac;
    }
    *outSumLogLikelihood = 0.0;
  }
  iVar24 = 0;
LAB_00127c01:
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar24;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}